

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

boolean jtransform_parse_crop_spec(jpeg_transform_info *info,char *spec)

{
  byte bVar1;
  boolean bVar2;
  ushort **ppuVar3;
  JCROP_CODE JVar4;
  byte *local_20;
  
  info->crop = 0;
  info->crop_width_set = JCROP_UNSET;
  info->crop_height_set = JCROP_UNSET;
  info->crop_xoffset_set = JCROP_UNSET;
  info->crop_yoffset_set = JCROP_UNSET;
  local_20 = (byte *)spec;
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + (long)*spec * 2 + 1) & 8) != 0) {
    bVar2 = jt_read_integer((char **)&local_20,&info->crop_width);
    if (bVar2 == 0) {
      return 0;
    }
    bVar1 = *local_20;
    JVar4 = JCROP_POS;
    if (bVar1 < 0x66) {
      if (bVar1 == 0x46) {
LAB_00110046:
        local_20 = local_20 + 1;
        JVar4 = JCROP_FORCE;
      }
      else if (bVar1 == 0x52) goto LAB_00110055;
    }
    else {
      if (bVar1 != 0x72) {
        if (bVar1 != 0x66) goto LAB_00110062;
        goto LAB_00110046;
      }
LAB_00110055:
      local_20 = local_20 + 1;
      JVar4 = JCROP_REFLECT;
    }
LAB_00110062:
    info->crop_width_set = JVar4;
  }
  if ((*local_20 | 0x20) != 0x78) goto LAB_001100da;
  local_20 = local_20 + 1;
  bVar2 = jt_read_integer((char **)&local_20,&info->crop_height);
  if (bVar2 == 0) {
    return 0;
  }
  bVar1 = *local_20;
  JVar4 = JCROP_POS;
  if (bVar1 < 0x66) {
    if (bVar1 == 0x46) {
LAB_001100ba:
      local_20 = local_20 + 1;
      JVar4 = JCROP_FORCE;
    }
    else if (bVar1 == 0x52) goto LAB_001100c9;
  }
  else {
    if (bVar1 != 0x72) {
      if (bVar1 != 0x66) goto LAB_001100d6;
      goto LAB_001100ba;
    }
LAB_001100c9:
    local_20 = local_20 + 1;
    JVar4 = JCROP_REFLECT;
  }
LAB_001100d6:
  info->crop_height_set = JVar4;
LAB_001100da:
  bVar1 = *local_20;
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    info->crop_xoffset_set = (bVar1 == 0x2d) + JCROP_POS;
    local_20 = local_20 + 1;
    bVar2 = jt_read_integer((char **)&local_20,&info->crop_xoffset);
    if (bVar2 == 0) {
      return 0;
    }
  }
  bVar1 = *local_20;
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    info->crop_yoffset_set = (bVar1 == 0x2d) + JCROP_POS;
    local_20 = local_20 + 1;
    bVar2 = jt_read_integer((char **)&local_20,&info->crop_yoffset);
    if (bVar2 == 0) {
      return 0;
    }
  }
  bVar1 = *local_20;
  if (bVar1 == 0) {
    info->crop = 1;
  }
  return (uint)(bVar1 == 0);
}

Assistant:

GLOBAL(boolean)
jtransform_parse_crop_spec(jpeg_transform_info *info, const char *spec)
{
  info->crop = FALSE;
  info->crop_width_set = JCROP_UNSET;
  info->crop_height_set = JCROP_UNSET;
  info->crop_xoffset_set = JCROP_UNSET;
  info->crop_yoffset_set = JCROP_UNSET;

  if (isdigit(*spec)) {
    /* fetch width */
    if (!jt_read_integer(&spec, &info->crop_width))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_width_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_width_set = JCROP_REFLECT;
    } else
      info->crop_width_set = JCROP_POS;
  }
  if (*spec == 'x' || *spec == 'X') {
    /* fetch height */
    spec++;
    if (!jt_read_integer(&spec, &info->crop_height))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_height_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_height_set = JCROP_REFLECT;
    } else
      info->crop_height_set = JCROP_POS;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch xoffset */
    info->crop_xoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_xoffset))
      return FALSE;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch yoffset */
    info->crop_yoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_yoffset))
      return FALSE;
  }
  /* We had better have gotten to the end of the string. */
  if (*spec != '\0')
    return FALSE;
  info->crop = TRUE;
  return TRUE;
}